

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

GLuint LoadShaders(char *vertex_file_path,char *fragment_file_path)

{
  PFNGLGETPROGRAMINFOLOGPROC p_Var1;
  PFNGLGETSHADERINFOLOGPROC p_Var2;
  undefined4 uVar3;
  GLsizei GVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  istream *piVar8;
  reference pvVar9;
  allocator_type local_591;
  undefined1 local_590 [8];
  vector<char,_std::allocator<char>_> ProgramErrorMessage;
  GLuint ProgramID;
  vector<char,_std::allocator<char>_> FragmentShaderErrorMessage;
  char *FragmentSourcePointer;
  undefined1 local_548 [8];
  vector<char,_std::allocator<char>_> VertexShaderErrorMessage;
  char *VertexSourcePointer;
  int InfoLogLength;
  GLint Result;
  allocator<char> local_4f9;
  undefined1 local_4f8 [8];
  string Line_1;
  ifstream FragmentShaderStream;
  string local_2d0 [8];
  string FragmentShaderCode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  allocator<char> local_281;
  undefined1 local_280 [8];
  string Line;
  istream local_250 [8];
  ifstream VertexShaderStream;
  string local_48 [8];
  string VertexShaderCode;
  GLuint FragmentShaderID;
  GLuint VertexShaderID;
  char *fragment_file_path_local;
  char *vertex_file_path_local;
  
  VertexShaderCode.field_2._12_4_ = (*__glewCreateShader)(0x8b31);
  VertexShaderCode.field_2._8_4_ = (*__glewCreateShader)(0x8b30);
  std::__cxx11::string::string(local_48);
  std::ifstream::ifstream(local_250,vertex_file_path,_S_in);
  bVar5 = std::ifstream::is_open();
  if ((bVar5 & 1) == 0) {
    printf("Impossible to open %s. Are you in the right directory ? Don\'t forget to read the FAQ !\n"
           ,vertex_file_path);
    getchar();
    vertex_file_path_local._4_4_ = 0;
    FragmentShaderCode.field_2._12_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_280,"",&local_281);
    std::allocator<char>::~allocator(&local_281);
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_250,(string *)local_280);
      bVar6 = std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
      if (!bVar6) break;
      std::operator+(&local_2a8,"\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280)
      ;
      std::__cxx11::string::operator+=(local_48,(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::string::string(local_2d0);
    std::ifstream::ifstream((void *)((long)&Line_1.field_2 + 8),fragment_file_path,_S_in);
    bVar5 = std::ifstream::is_open();
    if ((bVar5 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_4f8,"",&local_4f9);
      std::allocator<char>::~allocator(&local_4f9);
      while( true ) {
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)(Line_1.field_2._M_local_buf + 8),(string *)local_4f8);
        bVar6 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
        if (!bVar6) break;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &InfoLogLength,"\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f8);
        std::__cxx11::string::operator+=(local_2d0,(string *)&InfoLogLength);
        std::__cxx11::string::~string((string *)&InfoLogLength);
      }
      std::ifstream::close();
      std::__cxx11::string::~string((string *)local_4f8);
    }
    VertexSourcePointer._4_4_ = 0;
    printf("Compiling shader : %s\n",vertex_file_path);
    VertexShaderErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         std::__cxx11::string::c_str();
    (*__glewShaderSource)
              (VertexShaderCode.field_2._12_4_,1,
               (GLchar **)
               &VertexShaderErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                field_0x10,(GLint *)0x0);
    (*__glewCompileShader)(VertexShaderCode.field_2._12_4_);
    (*__glewGetShaderiv)
              (VertexShaderCode.field_2._12_4_,0x8b81,(GLint *)((long)&VertexSourcePointer + 4));
    (*__glewGetShaderiv)(VertexShaderCode.field_2._12_4_,0x8b84,(GLint *)&VertexSourcePointer);
    if (0 < (int)VertexSourcePointer) {
      iVar7 = (int)VertexSourcePointer + 1;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_548,(long)iVar7,
                 (allocator_type *)((long)&FragmentSourcePointer + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&FragmentSourcePointer + 7));
      uVar3 = VertexShaderCode.field_2._12_4_;
      GVar4 = (int)VertexSourcePointer;
      p_Var2 = __glewGetShaderInfoLog;
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_548,0);
      (*p_Var2)(uVar3,GVar4,(GLsizei *)0x0,pvVar9);
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_548,0);
      printf("%s\n",pvVar9);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_548);
    }
    printf("Compiling shader : %s\n",fragment_file_path);
    FragmentShaderErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         std::__cxx11::string::c_str();
    (*__glewShaderSource)
              (VertexShaderCode.field_2._8_4_,1,
               (GLchar **)
               &FragmentShaderErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                field_0x10,(GLint *)0x0);
    (*__glewCompileShader)(VertexShaderCode.field_2._8_4_);
    (*__glewGetShaderiv)
              (VertexShaderCode.field_2._8_4_,0x8b81,(GLint *)((long)&VertexSourcePointer + 4));
    (*__glewGetShaderiv)(VertexShaderCode.field_2._8_4_,0x8b84,(GLint *)&VertexSourcePointer);
    if (0 < (int)VertexSourcePointer) {
      iVar7 = (int)VertexSourcePointer + 1;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&ProgramID,(long)iVar7,
                 (allocator_type *)
                 &ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  field_0x17);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  field_0x17);
      uVar3 = VertexShaderCode.field_2._8_4_;
      GVar4 = (int)VertexSourcePointer;
      p_Var2 = __glewGetShaderInfoLog;
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)&ProgramID,0);
      (*p_Var2)(uVar3,GVar4,(GLsizei *)0x0,pvVar9);
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)&ProgramID,0);
      printf("%s\n",pvVar9);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&ProgramID);
    }
    printf("Linking program\n");
    ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
         (*__glewCreateProgram)();
    (*__glewAttachShader)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               VertexShaderCode.field_2._12_4_);
    (*__glewAttachShader)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               VertexShaderCode.field_2._8_4_);
    (*__glewLinkProgram)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
    (*__glewGetProgramiv)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               0x8b82,(GLint *)((long)&VertexSourcePointer + 4));
    (*__glewGetProgramiv)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               0x8b84,(GLint *)&VertexSourcePointer);
    if (0 < (int)VertexSourcePointer) {
      iVar7 = (int)VertexSourcePointer + 1;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_590,(long)iVar7,&local_591);
      std::allocator<char>::~allocator(&local_591);
      uVar3 = ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
      p_Var1 = __glewGetProgramInfoLog;
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_590,0);
      (*p_Var1)(uVar3,(int)VertexSourcePointer,(GLsizei *)0x0,pvVar9);
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_590,0);
      printf("%s\n",pvVar9);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_590);
    }
    (*__glewDetachShader)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               VertexShaderCode.field_2._12_4_);
    (*__glewDetachShader)
              (ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
               VertexShaderCode.field_2._8_4_);
    (*__glewDeleteShader)(VertexShaderCode.field_2._12_4_);
    (*__glewDeleteShader)(VertexShaderCode.field_2._8_4_);
    vertex_file_path_local._4_4_ =
         ProgramErrorMessage.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
    FragmentShaderCode.field_2._12_4_ = 1;
    std::ifstream::~ifstream((void *)((long)&Line_1.field_2 + 8));
    std::__cxx11::string::~string(local_2d0);
  }
  std::ifstream::~ifstream(local_250);
  std::__cxx11::string::~string(local_48);
  return vertex_file_path_local._4_4_;
}

Assistant:

GLuint LoadShaders(const char * vertex_file_path,const char * fragment_file_path){

	// Create the shaders
	GLuint VertexShaderID = glCreateShader(GL_VERTEX_SHADER);
	GLuint FragmentShaderID = glCreateShader(GL_FRAGMENT_SHADER);

	// Read the Vertex Shader code from the file
	std::string VertexShaderCode;
	std::ifstream VertexShaderStream(vertex_file_path, std::ios::in);
	if(VertexShaderStream.is_open()){
		std::string Line = "";
		while(getline(VertexShaderStream, Line))
			VertexShaderCode += "\n" + Line;
		VertexShaderStream.close();
	}else{
		printf("Impossible to open %s. Are you in the right directory ? Don't forget to read the FAQ !\n", vertex_file_path);
		getchar();
		return 0;
	}

	// Read the Fragment Shader code from the file
	std::string FragmentShaderCode;
	std::ifstream FragmentShaderStream(fragment_file_path, std::ios::in);
	if(FragmentShaderStream.is_open()){
		std::string Line = "";
		while(getline(FragmentShaderStream, Line))
			FragmentShaderCode += "\n" + Line;
		FragmentShaderStream.close();
	}

	GLint Result = GL_FALSE;
	int InfoLogLength;


	// Compile Vertex Shader
	printf("Compiling shader : %s\n", vertex_file_path);
	char const * VertexSourcePointer = VertexShaderCode.c_str();
	glShaderSource(VertexShaderID, 1, &VertexSourcePointer , NULL);
	glCompileShader(VertexShaderID);

	// Check Vertex Shader
	glGetShaderiv(VertexShaderID, GL_COMPILE_STATUS, &Result);
	glGetShaderiv(VertexShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
	if ( InfoLogLength > 0 ){
		std::vector<char> VertexShaderErrorMessage(InfoLogLength+1);
		glGetShaderInfoLog(VertexShaderID, InfoLogLength, NULL, &VertexShaderErrorMessage[0]);
		printf("%s\n", &VertexShaderErrorMessage[0]);
	}



	// Compile Fragment Shader
	printf("Compiling shader : %s\n", fragment_file_path);
	char const * FragmentSourcePointer = FragmentShaderCode.c_str();
	glShaderSource(FragmentShaderID, 1, &FragmentSourcePointer , NULL);
	glCompileShader(FragmentShaderID);

	// Check Fragment Shader
	glGetShaderiv(FragmentShaderID, GL_COMPILE_STATUS, &Result);
	glGetShaderiv(FragmentShaderID, GL_INFO_LOG_LENGTH, &InfoLogLength);
	if ( InfoLogLength > 0 ){
		std::vector<char> FragmentShaderErrorMessage(InfoLogLength+1);
		glGetShaderInfoLog(FragmentShaderID, InfoLogLength, NULL, &FragmentShaderErrorMessage[0]);
		printf("%s\n", &FragmentShaderErrorMessage[0]);
	}



	// Link the program
	printf("Linking program\n");
	GLuint ProgramID = glCreateProgram();
	glAttachShader(ProgramID, VertexShaderID);
	glAttachShader(ProgramID, FragmentShaderID);
	glLinkProgram(ProgramID);

	// Check the program
	glGetProgramiv(ProgramID, GL_LINK_STATUS, &Result);
	glGetProgramiv(ProgramID, GL_INFO_LOG_LENGTH, &InfoLogLength);
	if ( InfoLogLength > 0 ){
		std::vector<char> ProgramErrorMessage(InfoLogLength+1);
		glGetProgramInfoLog(ProgramID, InfoLogLength, NULL, &ProgramErrorMessage[0]);
		printf("%s\n", &ProgramErrorMessage[0]);
	}

	
	glDetachShader(ProgramID, VertexShaderID);
	glDetachShader(ProgramID, FragmentShaderID);
	
	glDeleteShader(VertexShaderID);
	glDeleteShader(FragmentShaderID);

	return ProgramID;
}